

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

RPCHelpMan * logging(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCResult> __l_02;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff198;
  allocator<RPCArg> *paVar1;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff1b0;
  Logger *in_stack_fffffffffffff1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff1d0;
  allocator<char> *in_stack_fffffffffffff1d8;
  iterator in_stack_fffffffffffff1e0;
  RPCArgOptions *in_stack_fffffffffffff1e8;
  string *in_stack_fffffffffffff1f0;
  undefined7 in_stack_fffffffffffff1f8;
  undefined1 in_stack_fffffffffffff1ff;
  undefined4 in_stack_fffffffffffff200;
  Type in_stack_fffffffffffff204;
  string *in_stack_fffffffffffff208;
  undefined4 in_stack_fffffffffffff210;
  Type in_stack_fffffffffffff214;
  undefined4 in_stack_fffffffffffff218;
  Type in_stack_fffffffffffff21c;
  RPCArg *in_stack_fffffffffffff220;
  RPCArgOptions *in_stack_fffffffffffff240;
  undefined1 *local_da0;
  undefined1 *local_d88;
  undefined1 *local_d70;
  undefined1 *local_d58;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  RPCMethodImpl *in_stack_fffffffffffff400;
  undefined1 local_be0 [36];
  allocator<char> local_bbc;
  allocator<char> local_bbb;
  allocator<char> local_bba [2];
  undefined1 local_bb8 [30];
  undefined1 local_b9a;
  vector<RPCArg,_std::allocator<RPCArg>_> local_b99;
  undefined1 local_b7a;
  undefined1 local_b79 [32];
  allocator<char> local_b59 [8];
  allocator<char> local_b51 [32];
  allocator<char> local_b31;
  undefined1 local_b30 [7];
  allocator<char> local_b29 [8];
  allocator<char> local_b21 [32];
  allocator<char> local_b01 [8];
  allocator<char> local_af9 [32];
  allocator<char> local_ad9 [321];
  undefined1 local_998 [136];
  undefined1 local_910 [200];
  allocator<RPCArg> local_848 [40];
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined1 local_808;
  undefined1 local_807;
  undefined1 local_800;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined1 local_7c0;
  undefined1 local_7bf;
  undefined1 local_718 [264];
  undefined1 local_610 [160];
  allocator<RPCArg> local_570 [40];
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined1 local_530;
  undefined1 local_52f;
  undefined1 local_528;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined1 local_4e8;
  undefined1 local_4e7;
  undefined1 local_440 [264];
  undefined1 local_338 [160];
  undefined1 local_298 [528];
  undefined1 local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1e8,(char *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
  LogInstance();
  BCLog::Logger::LogCategoriesString_abi_cxx11_(in_stack_fffffffffffff1c8);
  std::operator+((char *)in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8);
  std::operator+(in_stack_fffffffffffff1b0,(char *)in_stack_fffffffffffff1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1e8,(char *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
  local_b01[1] = (allocator<char>)0x1;
  local_b01[2] = (allocator<char>)0x0;
  local_b01[3] = (allocator<char>)0x0;
  local_b01[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff1a8,(Optional *)in_stack_fffffffffffff1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1e8,(char *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1e8,(char *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
  local_b29[1] = (allocator<char>)0x1;
  local_b29[2] = (allocator<char>)0x0;
  local_b29[3] = (allocator<char>)0x0;
  local_b29[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff1a8,(Optional *)in_stack_fffffffffffff1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1e8,(char *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
  local_528 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff1b0);
  local_500 = 0;
  uStack_4f8 = 0;
  local_4f0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff198);
  local_4e8 = 0;
  local_4e7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210),
                 in_stack_fffffffffffff208,in_stack_fffffffffffff204,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff1ff,in_stack_fffffffffffff1f8),
                 in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff198);
  __l._M_len = (size_type)in_stack_fffffffffffff1e8;
  __l._M_array = in_stack_fffffffffffff1e0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff1d8,__l,
             (allocator_type *)in_stack_fffffffffffff1d0);
  local_570[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_fffffffffffff1b0);
  local_548 = 0;
  uStack_540 = 0;
  local_538 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff198);
  local_530 = 0;
  local_52f = 0;
  paVar1 = local_570;
  RPCArg::RPCArg(in_stack_fffffffffffff220,
                 (string *)CONCAT44(in_stack_fffffffffffff21c,in_stack_fffffffffffff218),
                 in_stack_fffffffffffff214,(Fallback *)in_stack_fffffffffffff208,
                 (string *)CONCAT44(in_stack_fffffffffffff204,in_stack_fffffffffffff200),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_fffffffffffff1ff,in_stack_fffffffffffff1f8),
                 in_stack_fffffffffffff240);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1e8,(char *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
  local_b30._0_4_ = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff1a8,(Optional *)in_stack_fffffffffffff1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1e8,(char *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1e8,(char *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
  local_b59[1] = (allocator<char>)0x1;
  local_b59[2] = (allocator<char>)0x0;
  local_b59[3] = (allocator<char>)0x0;
  local_b59[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff1a8,(Optional *)in_stack_fffffffffffff1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1e8,(char *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
  local_800 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff1b0);
  local_7d8 = 0;
  uStack_7d0 = 0;
  local_7c8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar1);
  local_7c0 = 0;
  local_7bf = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210),
                 in_stack_fffffffffffff208,in_stack_fffffffffffff204,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff1ff,in_stack_fffffffffffff1f8),
                 in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
  std::allocator<RPCArg>::allocator(paVar1);
  __l_00._M_len = (size_type)in_stack_fffffffffffff1e8;
  __l_00._M_array = in_stack_fffffffffffff1e0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff1d8,__l_00,
             (allocator_type *)in_stack_fffffffffffff1d0);
  local_848[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_fffffffffffff1b0);
  local_820 = 0;
  uStack_818 = 0;
  local_810 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar1);
  local_808 = 0;
  local_807 = 0;
  paVar1 = local_848;
  RPCArg::RPCArg(in_stack_fffffffffffff220,
                 (string *)CONCAT44(in_stack_fffffffffffff21c,in_stack_fffffffffffff218),
                 in_stack_fffffffffffff214,(Fallback *)in_stack_fffffffffffff208,
                 (string *)CONCAT44(in_stack_fffffffffffff204,in_stack_fffffffffffff200),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_fffffffffffff1ff,in_stack_fffffffffffff1f8),
                 in_stack_fffffffffffff240);
  this_00 = (RPCHelpMan *)(local_b79 + 0x1e);
  std::allocator<RPCArg>::allocator(paVar1);
  __l_01._M_len = (size_type)in_stack_fffffffffffff1e8;
  __l_01._M_array = in_stack_fffffffffffff1e0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff1d8,__l_01,
             (allocator_type *)in_stack_fffffffffffff1d0);
  name = (string *)local_b79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1e8,(char *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
  description = (string *)&local_b7a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1e8,(char *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
  args = &local_b99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1e8,(char *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
  results = (RPCResults *)&local_b9a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1e8,(char *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
  local_bb8._0_8_ = (pointer)0x0;
  local_bb8._8_8_ = (pointer)0x0;
  local_bb8._16_8_ = 0;
  examples = (RPCExamples *)local_bb8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar1);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_fffffffffffff220,in_stack_fffffffffffff21c,
             (string *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210),
             in_stack_fffffffffffff208,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff204,in_stack_fffffffffffff200),
             (bool)in_stack_fffffffffffff1ff);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)paVar1);
  __l_02._M_len = (size_type)in_stack_fffffffffffff1e8;
  __l_02._M_array = (iterator)in_stack_fffffffffffff1e0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1d8,__l_02,
             (allocator_type *)in_stack_fffffffffffff1d0);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_fffffffffffff220,in_stack_fffffffffffff21c,
             (string *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210),
             in_stack_fffffffffffff208,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff204,in_stack_fffffffffffff200),
             (bool)in_stack_fffffffffffff1ff);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_fffffffffffff21c,in_stack_fffffffffffff218),
             (RPCResult *)CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1e8,(char *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1e8,(char *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
  HelpExampleCli(in_stack_fffffffffffff1d0,(string *)in_stack_fffffffffffff1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1e8,(char *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff1e8,(char *)in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8);
  HelpExampleRpc(in_stack_fffffffffffff1d0,(string *)in_stack_fffffffffffff1c8);
  std::operator+(in_stack_fffffffffffff1d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff1c8);
  RPCExamples::RPCExamples((RPCExamples *)paVar1,(string *)0x6751d7);
  this = (RPCArg *)local_be0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::function<logging()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
  RPCHelpMan::RPCHelpMan(this_00,name,description,args,results,examples,in_stack_fffffffffffff400);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_be0 + 0x23));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_bbc);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_bbb);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_bba);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1a8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_d58 = local_910;
  do {
    local_d58 = local_d58 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_d58 != local_998);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff1a8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_b99);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_b7a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_b79);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff1a8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_d70 = local_88;
  do {
    local_d70 = local_d70 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_d70 != local_298);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff1a8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_d88 = local_610;
  do {
    local_d88 = local_d88 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_d88 != local_718);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_b59);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_b51);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_b31);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_b30 + 5));
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff1a8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_da0 = local_338;
  do {
    local_da0 = local_da0 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_da0 != local_440);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_b29);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_b21);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_b01);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_af9);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_ad9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan logging()
{
    return RPCHelpMan{"logging",
            "Gets and sets the logging configuration.\n"
            "When called without an argument, returns the list of categories with status that are currently being debug logged or not.\n"
            "When called with arguments, adds or removes categories from debug logging and return the lists above.\n"
            "The arguments are evaluated in order \"include\", \"exclude\".\n"
            "If an item is both included and excluded, it will thus end up being excluded.\n"
            "The valid logging categories are: " + LogInstance().LogCategoriesString() + "\n"
            "In addition, the following are available as category names with special meanings:\n"
            "  - \"all\",  \"1\" : represent all logging categories.\n"
            ,
                {
                    {"include", RPCArg::Type::ARR, RPCArg::Optional::OMITTED, "The categories to add to debug logging",
                        {
                            {"include_category", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "the valid logging category"},
                        }},
                    {"exclude", RPCArg::Type::ARR, RPCArg::Optional::OMITTED, "The categories to remove from debug logging",
                        {
                            {"exclude_category", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "the valid logging category"},
                        }},
                },
                RPCResult{
                    RPCResult::Type::OBJ_DYN, "", "keys are the logging categories, and values indicates its status",
                    {
                        {RPCResult::Type::BOOL, "category", "if being debug logged or not. false:inactive, true:active"},
                    }
                },
                RPCExamples{
                    HelpExampleCli("logging", "\"[\\\"all\\\"]\" \"[\\\"http\\\"]\"")
            + HelpExampleRpc("logging", "[\"all\"], [\"libevent\"]")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    BCLog::CategoryMask original_log_categories = LogInstance().GetCategoryMask();
    if (request.params[0].isArray()) {
        EnableOrDisableLogCategories(request.params[0], true);
    }
    if (request.params[1].isArray()) {
        EnableOrDisableLogCategories(request.params[1], false);
    }
    BCLog::CategoryMask updated_log_categories = LogInstance().GetCategoryMask();
    BCLog::CategoryMask changed_log_categories = original_log_categories ^ updated_log_categories;

    // Update libevent logging if BCLog::LIBEVENT has changed.
    if (changed_log_categories & BCLog::LIBEVENT) {
        UpdateHTTPServerLogging(LogInstance().WillLogCategory(BCLog::LIBEVENT));
    }

    UniValue result(UniValue::VOBJ);
    for (const auto& logCatActive : LogInstance().LogCategoriesList()) {
        result.pushKV(logCatActive.category, logCatActive.active);
    }

    return result;
},
    };
}